

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O1

void __thiscall arangodb::velocypack::Dumper::dumpValue(Dumper *this,Slice slice,Slice *base)

{
  CustomTypeHandler *pCVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  Slice SVar5;
  int64_t v;
  uint8_t *puVar6;
  _func_int **pp_Var7;
  Exception *this_00;
  uint uVar8;
  ExceptionType type;
  uint64_t v_00;
  undefined8 uVar9;
  Sink *pSVar10;
  byte bVar11;
  uint8_t *puVar12;
  double v_01;
  ObjectPair OVar13;
  ValueLength len;
  Slice local_60;
  ArrayIterator local_58;
  double local_38;
  
  local_60._start = slice._start;
  if ((this->options->debugTags == true) && (bVar11 = *slice._start, (bVar11 & 0xfe) == 0xee)) {
    if (bVar11 == 0xef) {
      v_00 = *(uint64_t *)(slice._start + 1);
    }
    else if (bVar11 == 0xee) {
      v_00 = (uint64_t)slice._start[1];
    }
    else {
      v_00 = 0;
    }
    appendUInt(this,v_00);
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x3a);
  }
  switch(SliceStaticData::TypeMap[*local_60._start]) {
  case None:
  case Illegal:
  case MinKey:
  case MaxKey:
    goto switchD_0010cfc3_caseD_0;
  case Null:
    (*this->_sink->_vptr_Sink[3])(this->_sink,"null",4);
    return;
  case Bool:
    bVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBool
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_60);
    if (bVar3) {
      pcVar4 = "true";
      uVar9 = 4;
    }
    else {
      pcVar4 = "false";
      uVar9 = 5;
    }
    (*this->_sink->_vptr_Sink[3])(this->_sink,pcVar4,uVar9);
    break;
  case Array:
    ArrayIterator::ArrayIterator(&local_58,local_60);
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x5b);
    if (this->options->prettyPrint == true) {
      (*this->_sink->_vptr_Sink[2])(this->_sink,10);
      this->_indentation = this->_indentation + 1;
      if (local_58._position != local_58._size) {
        do {
          indent(this);
          SVar5 = ArrayIterator::value(&local_58);
          dumpValue(this,SVar5,&local_60);
          if (local_58._position + 1 != local_58._size) {
            (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          }
          (*this->_sink->_vptr_Sink[2])(this->_sink,10);
          ArrayIterator::next(&local_58);
        } while (local_58._position != local_58._size);
      }
      this->_indentation = this->_indentation + -1;
      indent(this);
    }
    else if (this->options->singleLinePrettyPrint == false) {
      if (local_58._position != local_58._size) {
        do {
          if (local_58._position != 0) {
            (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          }
          SVar5 = ArrayIterator::value(&local_58);
          dumpValue(this,SVar5,&local_60);
          ArrayIterator::next(&local_58);
        } while (local_58._position != local_58._size);
      }
    }
    else if (local_58._position != local_58._size) {
      do {
        if (local_58._position != 0) {
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x20);
        }
        SVar5 = ArrayIterator::value(&local_58);
        dumpValue(this,SVar5,&local_60);
        ArrayIterator::next(&local_58);
      } while (local_58._position != local_58._size);
    }
    pSVar10 = this->_sink;
    pp_Var7 = pSVar10->_vptr_Sink;
    uVar9 = 0x5d;
    goto LAB_0010d371;
  case Object:
    ObjectIterator::ObjectIterator
              ((ObjectIterator *)&local_58,local_60,
               (bool)(this->options->dumpAttributesInIndexOrder ^ 1));
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x7b);
    if (this->options->prettyPrint == true) {
      (*this->_sink->_vptr_Sink[2])(this->_sink,10);
      this->_indentation = this->_indentation + 1;
      if (local_58._position != local_58._size) {
        do {
          OVar13 = ObjectIterator::operator*((ObjectIterator *)&local_58);
          indent(this);
          dumpValue(this,OVar13.key._start,&local_60);
          (*this->_sink->_vptr_Sink[3])(this->_sink," : ",3);
          dumpValue(this,OVar13.value._start,&local_60);
          if (local_58._position + 1 != local_58._size) {
            (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          }
          (*this->_sink->_vptr_Sink[2])(this->_sink,10);
          ObjectIterator::next((ObjectIterator *)&local_58);
        } while (local_58._position != local_58._size);
      }
      this->_indentation = this->_indentation + -1;
      indent(this);
    }
    else if (this->options->singleLinePrettyPrint == false) {
      if (local_58._position != local_58._size) {
        do {
          if (local_58._position != 0) {
            (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          }
          OVar13 = ObjectIterator::operator*((ObjectIterator *)&local_58);
          dumpValue(this,OVar13.key._start,&local_60);
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x3a);
          dumpValue(this,OVar13.value._start,&local_60);
          ObjectIterator::next((ObjectIterator *)&local_58);
        } while (local_58._position != local_58._size);
      }
    }
    else if (local_58._position != local_58._size) {
      do {
        if (local_58._position != 0) {
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x2c);
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x20);
        }
        OVar13 = ObjectIterator::operator*((ObjectIterator *)&local_58);
        dumpValue(this,OVar13.key._start,&local_60);
        (*this->_sink->_vptr_Sink[2])(this->_sink,0x3a);
        (*this->_sink->_vptr_Sink[2])(this->_sink,0x20);
        dumpValue(this,OVar13.value._start,&local_60);
        ObjectIterator::next((ObjectIterator *)&local_58);
      } while (local_58._position != local_58._size);
    }
    pSVar10 = this->_sink;
    pp_Var7 = pSVar10->_vptr_Sink;
    uVar9 = 0x7d;
    goto LAB_0010d371;
  case Double:
    v_01 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getDouble
                     ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                      &local_60);
    if (ABS(v_01) != INFINITY && !NAN(v_01)) {
      appendDouble(this,v_01);
      return;
    }
    if (this->options->unsupportedDoublesAsString == true) {
      if (NAN(v_01)) {
        pSVar10 = this->_sink;
        pp_Var7 = pSVar10->_vptr_Sink;
        pcVar4 = "\"NaN\"";
        uVar9 = 5;
      }
      else {
        if (ABS(v_01) != INFINITY) goto LAB_0010d57f;
        local_38 = v_01;
        (*this->_sink->_vptr_Sink[2])(this->_sink,0x22);
        if (local_38 <= -INFINITY) {
          (*this->_sink->_vptr_Sink[2])(this->_sink,0x2d);
        }
        pSVar10 = this->_sink;
        pp_Var7 = pSVar10->_vptr_Sink;
        pcVar4 = "Infinity\"";
        uVar9 = 9;
      }
      (*pp_Var7[3])(pSVar10,pcVar4,uVar9);
    }
    else {
LAB_0010d57f:
      handleUnsupportedType(this,local_60);
    }
    break;
  case UTCDate:
    if (this->options->datesAsIntegers == true) {
      v = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getUTCDate
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                     &local_60);
      appendInt(this,v);
      return;
    }
    goto switchD_0010cfc3_caseD_0;
  case External:
    if (base == (Slice *)0x0) {
      base = &local_60;
    }
    SVar5._start = (uint8_t *)
                   SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getExternal
                             ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *
                              )&local_60);
    dumpValue(this,SVar5,base);
    break;
  case Int:
  case UInt:
  case SmallInt:
    dumpInteger(this,local_60);
    return;
  case String:
    pcVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getString
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        &local_60,(ValueLength *)&local_58);
    (*this->_sink->_vptr_Sink[4])(this->_sink,local_58._slice._start + 2);
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x22);
    dumpString(this,pcVar4,(ValueLength)local_58._slice._start);
    goto LAB_0010d365;
  case Binary:
    if (this->options->binaryAsHex != true) goto switchD_0010cfc3_caseD_0;
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x22);
    puVar6 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBinary
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        &local_60,(ValueLength *)&local_58);
    if (local_58._slice._start != (uint8_t *)0x0) {
      puVar12 = (uint8_t *)0x0;
      do {
        bVar11 = puVar6[(long)puVar12];
        uVar8 = (uint)(byte)((bVar11 >> 4) + 0x57);
        if (bVar11 < 0xa0) {
          uVar8 = (bVar11 >> 4) + 0x30;
        }
        (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)uVar8);
        bVar11 = bVar11 & 0xf;
        bVar2 = bVar11 + 0x57;
        if (bVar11 < 10) {
          bVar2 = bVar11 + 0x30;
        }
        (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)bVar2);
        puVar12 = puVar12 + 1;
      } while (puVar12 < local_58._slice._start);
    }
LAB_0010d365:
    pSVar10 = this->_sink;
    pp_Var7 = pSVar10->_vptr_Sink;
    uVar9 = 0x22;
LAB_0010d371:
    (*pp_Var7[2])(pSVar10,uVar9);
    break;
  case BCD:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    type = NotImplemented;
LAB_0010d693:
    Exception::Exception(this_00,type);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  case Custom:
    pCVar1 = this->options->customTypeHandler;
    if (pCVar1 == (CustomTypeHandler *)0x0) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      type = NeedCustomTypeHandler;
      goto LAB_0010d693;
    }
    if (base == (Slice *)0x0) {
      base = &local_60;
    }
    (*pCVar1->_vptr_CustomTypeHandler[2])(pCVar1,&local_60,this,base);
    break;
  case Tagged:
    SVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::value
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_60);
    dump(this,SVar5);
  }
  return;
switchD_0010cfc3_caseD_0:
  handleUnsupportedType(this,local_60);
  return;
}

Assistant:

void Dumper::dumpValue(Slice slice, Slice const* base) {
  if (options->debugTags && slice.isTagged()) {
    appendUInt(slice.getFirstTag());
    _sink->push_back(':');
  }

  switch (slice.type()) {
    case ValueType::Null: {
      _sink->append("null", 4);
      break;
    }

    case ValueType::Bool: {
      if (slice.getBool()) {
        _sink->append("true", 4);
      } else {
        _sink->append("false", 5);
      }
      break;
    }

    case ValueType::Array: {
      ArrayIterator it(slice);
      _sink->push_back('[');
      if (options->prettyPrint) {
        _sink->push_back('\n');
        ++_indentation;
        while (it.valid()) {
          indent();
          dumpValue(it.value(), &slice);
          if (it.index() + 1 != it.size()) {
            _sink->push_back(',');
          }
          _sink->push_back('\n');
          it.next();
        }
        --_indentation;
        indent();
      } else if (options->singleLinePrettyPrint) {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
            _sink->push_back(' ');
          }
          dumpValue(it.value(), &slice);
          it.next();
        }
      } else {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
          }
          dumpValue(it.value(), &slice);
          it.next();
        }
      }
      _sink->push_back(']');
      break;
    }

    case ValueType::Object: {
      ObjectIterator it(slice, !options->dumpAttributesInIndexOrder);
      _sink->push_back('{');
      if (options->prettyPrint) {
        _sink->push_back('\n');
        ++_indentation;
        while (it.valid()) {
          auto current = (*it);
          indent();
          dumpValue(current.key, &slice);
          _sink->append(" : ", 3);
          dumpValue(current.value, &slice);
          if (it.index() + 1 != it.size()) {
            _sink->push_back(',');
          }
          _sink->push_back('\n');
          it.next();
        }
        --_indentation;
        indent();
      } else if (options->singleLinePrettyPrint) {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
            _sink->push_back(' ');
          }
          auto current = (*it);
          dumpValue(current.key, &slice);
          _sink->push_back(':');
          _sink->push_back(' ');
          dumpValue(current.value, &slice);
          it.next();
        }
      } else {
        while (it.valid()) {
          if (it.index() != 0) {
            _sink->push_back(',');
          }
          auto current = (*it);
          dumpValue(current.key, &slice);
          _sink->push_back(':');
          dumpValue(current.value, &slice);
          it.next();
        }
      }
      _sink->push_back('}');
      break;
    }

    case ValueType::Double: {
      double const v = slice.getDouble();

      if (!std::isnan(v) && !std::isinf(v)) {
        appendDouble(v);
        break;
      }

      if (options->unsupportedDoublesAsString) {
        if (std::isnan(v)) {
          _sink->append("\"NaN\"", 5);
          break;
        } else if (std::isinf(v)) {
          _sink->push_back('"');
          if (v == -INFINITY) {
            _sink->push_back('-');
          }
          _sink->append("Infinity\"", 9);
          break;
        }
      }

      handleUnsupportedType(slice);
      break;
    }

    case ValueType::Int:
    case ValueType::UInt:
    case ValueType::SmallInt: {
      dumpInteger(slice);
      break;
    }

    case ValueType::String: {
      ValueLength len;
      char const* p = slice.getString(len);
      _sink->reserve(2 + len);
      _sink->push_back('"');
      dumpString(p, len);
      _sink->push_back('"');
      break;
    }

    case ValueType::External: {
      if (base == nullptr) {
        base = &slice;
      }

      Slice external(reinterpret_cast<uint8_t const*>(slice.getExternal()));
      dumpValue(external, base);
      break;
    }

    case ValueType::Tagged: {
      dump(slice.value());
      break;
    }

    case ValueType::Binary: {
      if (options->binaryAsHex) {
        _sink->push_back('"');
        ValueLength len;
        uint8_t const* bin = slice.getBinary(len);
        for (ValueLength i = 0; i < len; ++i) {
          uint8_t value = bin[i];
          uint8_t x = value / 16;
          _sink->push_back((x < 10 ? ('0' + x) : ('a' + x - 10)));
          x = value % 16;
          _sink->push_back((x < 10 ? ('0' + x) : ('a' + x - 10)));
        }
        _sink->push_back('"');
      } else {
        handleUnsupportedType(slice);
      }
      break;
    }

    case ValueType::UTCDate: {
      if (options->datesAsIntegers) {
        appendInt(slice.getUTCDate());
      } else {
        handleUnsupportedType(slice);
      }
      break;
    }

    case ValueType::None:
    case ValueType::Illegal:
    case ValueType::MinKey:
    case ValueType::MaxKey: {
      handleUnsupportedType(slice);
      break;
    }

    case ValueType::BCD: {
      // TODO
      throw Exception(Exception::NotImplemented);
    }

    case ValueType::Custom: {
      if (options->customTypeHandler == nullptr) {
        throw Exception(Exception::NeedCustomTypeHandler);
      }
      if (base == nullptr) {
        base = &slice;
      }
      options->customTypeHandler->dump(slice, this, *base);
      break;
    }
  }
}